

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptError.cpp
# Opt level: O3

Var Js::JavascriptError::EntryToString(RecyclableObject *function,CallInfo callInfo,...)

{
  Type TVar1;
  ScriptContext *pSVar2;
  JavascriptLibrary *pJVar3;
  code *pcVar4;
  CallInfo CVar5;
  bool bVar6;
  BOOL BVar7;
  charcount_t cVar8;
  charcount_t cVar9;
  undefined4 *puVar10;
  Var pvVar11;
  RecyclableObject *pRVar12;
  RecyclableObject *this;
  JavascriptString *pJVar13;
  JavascriptString *this_00;
  StaticType *pSVar14;
  JavascriptString *pstRight;
  char *pcVar15;
  char *pcVar16;
  uint uVar17;
  char *pcVar18;
  int in_stack_00000010;
  undefined1 local_48 [8];
  ArgumentReader args;
  CallInfo callInfo_local;
  Var value;
  
  pSVar2 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  args.super_Arguments.Values = (Type)callInfo;
  ThreadContext::ProbeStack(pSVar2->threadContext,0xc00,pSVar2,(PVOID)0x0);
  if (in_stack_00000010 != callInfo._0_4_) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptError.cpp"
                                ,0xbc,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar6) goto LAB_00bbc959;
    *puVar10 = 0;
  }
  args.super_Arguments.Info = (Type)&stack0x00000018;
  local_48 = (undefined1  [8])callInfo;
  ArgumentReader::AdjustArguments
            ((ArgumentReader *)local_48,(CallInfo *)&args.super_Arguments.Values);
  pSVar2 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  if (((ulong)local_48 & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptError.cpp"
                                ,0xbf,"(args.Info.Count > 0)","Should always have implicit \'this\'"
                               );
    if (!bVar6) goto LAB_00bbc959;
    *puVar10 = 0;
  }
  if (((ulong)args.super_Arguments.Values & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptError.cpp"
                                ,0xc1,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar6) goto LAB_00bbc959;
    *puVar10 = 0;
  }
  pvVar11 = Arguments::operator[]((Arguments *)local_48,0);
  if (pvVar11 == (Var)0x0) {
LAB_00bbc95b:
    ThrowTypeError(pSVar2,-0x7ff5ec41,L"Error.prototype.toString");
  }
  pvVar11 = Arguments::operator[]((Arguments *)local_48,0);
  BVar7 = JavascriptOperators::IsObject(pvVar11);
  if (BVar7 == 0) goto LAB_00bbc95b;
  pvVar11 = Arguments::operator[]((Arguments *)local_48,0);
  pRVar12 = VarTo<Js::RecyclableObject>(pvVar11);
  callInfo_local = (CallInfo)0x0;
  BVar7 = JavascriptOperators::GetPropertyNoCache(pRVar12,0x106,(Var *)&callInfo_local,pSVar2);
  CVar5 = callInfo_local;
  if (BVar7 == 0) {
LAB_00bbc63b:
    pJVar3 = (pSVar2->super_ScriptContextBase).javascriptLibrary;
    pSVar14 = StringCache::GetStringTypeStatic(&pJVar3->stringCache);
    pJVar13 = &LiteralString::New(pSVar14,L"Error",5,pJVar3->recycler)->super_JavascriptString;
  }
  else {
    if (callInfo_local == (CallInfo)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar10 = 1;
      bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
      if (!bVar6) goto LAB_00bbc959;
      *puVar10 = 0;
LAB_00bbc5c2:
      this = UnsafeVarTo<Js::RecyclableObject>((Var)CVar5);
      if (this == (RecyclableObject *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar10 = 1;
        bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
        if (!bVar6) goto LAB_00bbc959;
        *puVar10 = 0;
      }
      TVar1 = ((this->type).ptr)->typeId;
      if ((int)TVar1 < 0x58) {
        if (TVar1 == TypeIds_Undefined) goto LAB_00bbc63b;
      }
      else {
        BVar7 = RecyclableObject::IsExternal(this);
        if (BVar7 == 0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar10 = 1;
          pcVar18 = 
          "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
          ;
          pcVar16 = "(typeId < TypeIds_Limit || obj->IsExternal())";
          pcVar15 = "GetTypeId aValue has invalid TypeId";
          uVar17 = 0xe;
          goto LAB_00bbc6b5;
        }
      }
    }
    else if (((ulong)callInfo_local & 0x1ffff00000000) == 0x1000000000000 ||
             ((ulong)callInfo_local & 0xffff000000000000) != 0x1000000000000) {
      if ((ulong)callInfo_local >> 0x32 == 0 &&
          ((ulong)callInfo_local & 0xffff000000000000) != 0x1000000000000) goto LAB_00bbc5c2;
    }
    else {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar10 = 1;
      pcVar18 = 
      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
      ;
      pcVar16 = "((uintptr_t)aValue >> 32 == (AtomTag << 16))";
      pcVar15 = "(uintptr_t)aValue >> 32 == (AtomTag << 16)";
      uVar17 = 0x2a;
LAB_00bbc6b5:
      bVar6 = Throw::ReportAssert(pcVar18,uVar17,pcVar16,pcVar15);
      if (!bVar6) goto LAB_00bbc959;
      *puVar10 = 0;
    }
    pJVar13 = JavascriptConversion::ToString((Var)callInfo_local,pSVar2);
  }
  BVar7 = JavascriptOperators::GetPropertyNoCache(pRVar12,0x102,(Var *)&callInfo_local,pSVar2);
  CVar5 = callInfo_local;
  if (BVar7 == 0) {
LAB_00bbc866:
    this_00 = JavascriptLibrary::GetEmptyString((pSVar2->super_ScriptContextBase).javascriptLibrary)
    ;
    goto LAB_00bbc8de;
  }
  if (callInfo_local == (CallInfo)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar6) goto LAB_00bbc959;
    *puVar10 = 0;
LAB_00bbc7f1:
    pRVar12 = UnsafeVarTo<Js::RecyclableObject>((Var)CVar5);
    if (pRVar12 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar10 = 1;
      bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar6) goto LAB_00bbc959;
      *puVar10 = 0;
    }
    TVar1 = ((pRVar12->type).ptr)->typeId;
    if ((int)TVar1 < 0x58) {
      if (TVar1 == TypeIds_Undefined) goto LAB_00bbc866;
    }
    else {
      BVar7 = RecyclableObject::IsExternal(pRVar12);
      if (BVar7 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar10 = 1;
        pcVar18 = 
        "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
        ;
        pcVar16 = "(typeId < TypeIds_Limit || obj->IsExternal())";
        pcVar15 = "GetTypeId aValue has invalid TypeId";
        uVar17 = 0xe;
        goto LAB_00bbc8be;
      }
    }
  }
  else if (((ulong)callInfo_local & 0x1ffff00000000) == 0x1000000000000 ||
           ((ulong)callInfo_local & 0xffff000000000000) != 0x1000000000000) {
    if ((ulong)callInfo_local >> 0x32 == 0 &&
        ((ulong)callInfo_local & 0xffff000000000000) != 0x1000000000000) goto LAB_00bbc7f1;
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    pcVar18 = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
    ;
    pcVar16 = "((uintptr_t)aValue >> 32 == (AtomTag << 16))";
    pcVar15 = "(uintptr_t)aValue >> 32 == (AtomTag << 16)";
    uVar17 = 0x2a;
LAB_00bbc8be:
    bVar6 = Throw::ReportAssert(pcVar18,uVar17,pcVar16,pcVar15);
    if (!bVar6) {
LAB_00bbc959:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar10 = 0;
  }
  this_00 = JavascriptConversion::ToString((Var)callInfo_local,pSVar2);
LAB_00bbc8de:
  cVar8 = JavascriptString::GetLength(pJVar13);
  cVar9 = JavascriptString::GetLength(this_00);
  if ((cVar8 == 0) || (cVar9 == 0)) {
    if (cVar9 != 0) {
      pJVar13 = this_00;
    }
  }
  else {
    pJVar3 = (pSVar2->super_ScriptContextBase).javascriptLibrary;
    pSVar14 = StringCache::GetStringTypeStatic(&pJVar3->stringCache);
    pstRight = &LiteralString::New(pSVar14,L": ",2,pJVar3->recycler)->super_JavascriptString;
    pJVar13 = JavascriptString::Concat(pJVar13,pstRight);
    pJVar13 = JavascriptString::Concat(pJVar13,this_00);
  }
  return pJVar13;
}

Assistant:

Var JavascriptError::EntryToString(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();

        AssertMsg(args.Info.Count > 0, "Should always have implicit 'this'");

        Assert(!(callInfo.Flags & CallFlags_New));

        if (args[0] == 0 || !JavascriptOperators::IsObject(args[0]))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NeedObject, _u("Error.prototype.toString"));
        }

        RecyclableObject* thisError = VarTo<RecyclableObject>(args[0]);
        Var value = NULL;
        JavascriptString *outputStr, *message;

        // get error.name
        BOOL hasName = JavascriptOperators::GetPropertyNoCache(thisError, PropertyIds::name, &value, scriptContext) &&
            JavascriptOperators::GetTypeId(value) != TypeIds_Undefined;

        if (hasName)
        {
            outputStr = JavascriptConversion::ToString(value, scriptContext);
        }
        else
        {
            outputStr = scriptContext->GetLibrary()->CreateStringFromCppLiteral(_u("Error"));
        }

        // get error.message
        if (JavascriptOperators::GetPropertyNoCache(thisError, PropertyIds::message, &value, scriptContext)
            && JavascriptOperators::GetTypeId(value) != TypeIds_Undefined)
        {
            message = JavascriptConversion::ToString(value, scriptContext);
        }
        else
        {
            message = scriptContext->GetLibrary()->GetEmptyString();
        }

        charcount_t nameLen = outputStr->GetLength();
        charcount_t msgLen = message->GetLength();

        if (nameLen > 0 && msgLen > 0)
        {
            outputStr = JavascriptString::Concat(outputStr, scriptContext->GetLibrary()->CreateStringFromCppLiteral(_u(": ")));
            outputStr = JavascriptString::Concat(outputStr, message);
        }
        else if (msgLen > 0)
        {
            outputStr = message;
        }

        return outputStr;
    }